

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  uchar *local_690;
  size_t len;
  size_t left;
  uchar *in__;
  size_t inlen__;
  uint8_t block [64];
  ulong local_620;
  size_t i;
  blake2s_state FS [1];
  blake2s_state S [8] [1];
  uint8_t hash [8] [32];
  size_t keylen_local;
  void *key_local;
  size_t inlen_local;
  void *in_local;
  size_t outlen_local;
  void *out_local;
  
  if ((in == (void *)0x0) && (inlen != 0)) {
    out_local._4_4_ = -1;
  }
  else if (out == (void *)0x0) {
    out_local._4_4_ = -1;
  }
  else if ((key == (void *)0x0) && (keylen != 0)) {
    out_local._4_4_ = -1;
  }
  else if ((outlen == 0) || (0x20 < outlen)) {
    out_local._4_4_ = -1;
  }
  else if (keylen < 0x21) {
    for (local_620 = 0; local_620 < 8; local_620 = local_620 + 1) {
      iVar1 = blake2sp_init_leaf((blake2s_state *)&S[local_620 - 1][0].last_node,outlen,keylen,
                                 (uint32_t)local_620);
      if (iVar1 < 0) {
        return -1;
      }
    }
    S[7][0].outlen._0_1_ = 1;
    if (keylen != 0) {
      memset(&inlen__,0,0x40);
      memcpy(&inlen__,key,keylen);
      for (local_620 = 0; local_620 < 8; local_620 = local_620 + 1) {
        blake2s_update((blake2s_state *)&S[local_620 - 1][0].last_node,&inlen__,0x40);
      }
      secure_zero_memory(&inlen__,0x40);
    }
    for (local_620 = 0; local_620 < 8; local_620 = local_620 + 1) {
      left = local_620 * 0x40 + (long)in;
      for (in__ = (uchar *)inlen; (uchar *)0x1ff < in__; in__ = in__ + -0x200) {
        blake2s_update((blake2s_state *)&S[local_620 - 1][0].last_node,(void *)left,0x40);
        left = left + 0x200;
      }
      if ((uchar *)(local_620 << 6) < in__) {
        local_690 = in__ + local_620 * -0x40;
        if ((uchar *)0x40 < local_690) {
          local_690 = (uchar *)0x40;
        }
        blake2s_update((blake2s_state *)&S[local_620 - 1][0].last_node,(void *)left,
                       (size_t)local_690);
      }
      blake2s_final((blake2s_state *)&S[local_620 - 1][0].last_node,hash[local_620 - 1] + 0x18,0x20)
      ;
    }
    iVar1 = blake2sp_init_root((blake2s_state *)&i,outlen,keylen);
    if (iVar1 < 0) {
      out_local._4_4_ = -1;
    }
    else {
      FS[0].outlen._0_1_ = 1;
      for (local_620 = 0; local_620 < 8; local_620 = local_620 + 1) {
        blake2s_update((blake2s_state *)&i,hash[local_620 - 1] + 0x18,0x20);
      }
      out_local._4_4_ = blake2s_final((blake2s_state *)&i,out,outlen);
    }
  }
  else {
    out_local._4_4_ = -1;
  }
  return out_local._4_4_;
}

Assistant:

int blake2sp( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  blake2s_state S[PARALLELISM_DEGREE][1];
  blake2s_state FS[1];
  size_t i;

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S[PARALLELISM_DEGREE - 1]->last_node = 1; /* mark last node */

  if( keylen > 0 )
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S,hash), num_threads(PARALLELISM_DEGREE)
#else

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }

    if( inlen__ > i * BLAKE2S_BLOCKBYTES )
    {
      const size_t left = inlen__ - i * BLAKE2S_BLOCKBYTES;
      const size_t len = left <= BLAKE2S_BLOCKBYTES ? left : BLAKE2S_BLOCKBYTES;
      blake2s_update( S[i], in__, len );
    }

    blake2s_final( S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  if( blake2sp_init_root( FS, outlen, keylen ) < 0 )
    return -1;

  FS->last_node = 1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( FS, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( FS, out, outlen );
}